

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall
SQCompilation::SQParser::parseCommaExpr(SQParser *this,SQExpressionContext expression_context)

{
  Arena *args;
  SQParser *in_RDI;
  CommaExpr *cm;
  Expr *expr;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff88;
  CommaExpr *in_stack_ffffffffffffff90;
  SQParser *this_00;
  SQParser *this_01;
  SQParser *local_28;
  NestingChecker local_20 [2];
  
  NestingChecker::NestingChecker
            ((NestingChecker *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_28 = (SQParser *)Expression((SQParser *)nc._8_8_,nc._p._4_4_);
  if (in_RDI->_token == 0x2c) {
    args = arena(in_RDI);
    local_28 = (SQParser *)newNode<SQCompilation::CommaExpr,Arena*>(in_RDI,args);
    this_01 = local_28;
    CommaExpr::addExpression(in_stack_ffffffffffffff90,(Expr *)in_stack_ffffffffffffff88);
    while (in_RDI->_token == 0x2c) {
      Lex(this_01);
      this_00 = local_28;
      Expression((SQParser *)nc._8_8_,nc._p._4_4_);
      CommaExpr::addExpression((CommaExpr *)this_00,(Expr *)in_stack_ffffffffffffff88);
    }
  }
  NestingChecker::~NestingChecker(local_20);
  return (Expr *)local_28;
}

Assistant:

Expr* SQParser::parseCommaExpr(SQExpressionContext expression_context)
{
    NestingChecker nc(this);
    Expr *expr = Expression(expression_context);

    if (_token == ',') {
        CommaExpr *cm = newNode<CommaExpr>(arena());
        cm->addExpression(expr);
        expr = cm;
        while (_token == ',') {
            Lex();
            cm->addExpression(Expression(expression_context));
        }
    }

    return expr;
}